

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O2

void __thiscall
upb_test::FuzzTest_DuplicateOneofIndex_Test::TestBody(FuzzTest_DuplicateOneofIndex_Test *this)

{
  string_view text_proto;
  ParseTextProtoOrDie local_70;
  FileDescriptorSet local_50;
  
  text_proto._M_str =
       "file {\n             name: \"F\"\n             message_type {\n               name: \"M\"\n               oneof_decl { name: \"O\" }\n               field { name: \"f1\" number: 1 type: TYPE_INT32 oneof_index: 0 }\n               field { name: \"f2\" number: 1 type: TYPE_INT32 oneof_index: 0 }\n             }\n           }"
  ;
  text_proto._M_len = 0x132;
  ParseTextProtoOrDie::ParseTextProtoOrDie(&local_70,text_proto);
  ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet(&local_50,&local_70);
  RoundTripDescriptor(&local_50);
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

TEST(FuzzTest, DuplicateOneofIndex) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             name: "F"
             message_type {
               name: "M"
               oneof_decl { name: "O" }
               field { name: "f1" number: 1 type: TYPE_INT32 oneof_index: 0 }
               field { name: "f2" number: 1 type: TYPE_INT32 oneof_index: 0 }
             }
           })pb"));
}